

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe34At2(uint8_t *buf)

{
  return (ulong)(*(ushort *)(buf + 3) & 0xfff) << 0x16 | (ulong)buf[2] << 0xe | (ulong)buf[1] << 6 |
         (ulong)(*buf >> 2);
}

Assistant:

std::uint64_t readFlUIntLe34At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 6;
    res |= (buf[0] >> 2);
    res &= UINT64_C(0x3ffffffff);
    return res;
}